

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O0

Vec_Wrd_t * Gia_ManSimPatValues(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Wrd_t *p_00;
  Vec_Wrd_t *p_01;
  Gia_Obj_t *pObj;
  word *__dest;
  word *__src;
  bool bVar4;
  Vec_Wrd_t *vValues;
  Vec_Wrd_t *vSims;
  int local_18;
  int nWords;
  int Id;
  int i;
  Gia_Man_t *p_local;
  
  iVar1 = Vec_WrdSize(p->vSimsPi);
  iVar2 = Gia_ManCiNum(p);
  iVar1 = iVar1 / iVar2;
  p_00 = Gia_ManSimPatSim(p);
  iVar2 = Gia_ManCoNum(p);
  p_01 = Vec_WrdStart(iVar2 * iVar1);
  iVar2 = Vec_WrdSize(p->vSimsPi);
  iVar3 = Gia_ManCiNum(p);
  if (iVar2 != iVar1 * iVar3) {
    __assert_fail("Vec_WrdSize(p->vSimsPi) == nWords * Gia_ManCiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x9b,"Vec_Wrd_t *Gia_ManSimPatValues(Gia_Man_t *)");
  }
  iVar2 = Vec_WrdSize(p_01);
  iVar3 = Gia_ManCoNum(p);
  if (iVar2 == iVar1 * iVar3) {
    iVar2 = Vec_WrdSize(p_00);
    iVar3 = Gia_ManObjNum(p);
    if (iVar2 == iVar1 * iVar3) {
      nWords = 0;
      while( true ) {
        iVar2 = Vec_IntSize(p->vCos);
        bVar4 = false;
        if (nWords < iVar2) {
          pObj = Gia_ManCo(p,nWords);
          local_18 = Gia_ObjId(p,pObj);
          bVar4 = local_18 != 0;
        }
        if (!bVar4) break;
        __dest = Vec_WrdEntryP(p_01,iVar1 * nWords);
        __src = Vec_WrdEntryP(p_00,iVar1 * local_18);
        memcpy(__dest,__src,(long)iVar1 << 3);
        nWords = nWords + 1;
      }
      Vec_WrdFree(p_00);
      return p_01;
    }
    __assert_fail("Vec_WrdSize(vSims) == nWords * Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x9d,"Vec_Wrd_t *Gia_ManSimPatValues(Gia_Man_t *)");
  }
  __assert_fail("Vec_WrdSize(vValues) == nWords * Gia_ManCoNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                ,0x9c,"Vec_Wrd_t *Gia_ManSimPatValues(Gia_Man_t *)");
}

Assistant:

Vec_Wrd_t * Gia_ManSimPatValues( Gia_Man_t * p )
{
    int i, Id, nWords   = Vec_WrdSize(p->vSimsPi) / Gia_ManCiNum(p);
    Vec_Wrd_t * vSims   = Gia_ManSimPatSim( p ); 
    Vec_Wrd_t * vValues = Vec_WrdStart( Gia_ManCoNum(p)  * nWords ); 
    assert( Vec_WrdSize(p->vSimsPi) == nWords * Gia_ManCiNum(p)  );
    assert( Vec_WrdSize(vValues)    == nWords * Gia_ManCoNum(p)  );
    assert( Vec_WrdSize(vSims)      == nWords * Gia_ManObjNum(p) );
    Gia_ManForEachCoId( p, Id, i )
        memcpy( Vec_WrdEntryP(vValues, nWords * i), Vec_WrdEntryP(vSims, nWords * Id), sizeof(word)* nWords );
    Vec_WrdFree( vSims );
    return vValues;
}